

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vary_output_len.c
# Opt level: O0

int generate_input(uint8_t *buf,int len)

{
  int local_20;
  int i;
  int len_local;
  uint8_t *buf_local;
  
  for (local_20 = 0; local_20 < len; local_20 = local_20 + 1) {
    buf[local_20] = (uint8_t)(local_20 % 0xfb);
  }
  return buf_local._4_4_;
}

Assistant:

int generate_input(uint8_t *buf, int len)
{
	for (int i = 0; i < len; i++) {
		buf[i] = i % TEST_INPUT_MODULO;
	}
}